

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void deqp::gles3::Performance::anon_unknown_1::generateLayeredGridVertexAttribData4C4V
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
               LayeredGridSpec *scene)

{
  undefined4 uVar1;
  undefined4 uVar3;
  pointer pVVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  int iVar13;
  Vector<float,_4> *v;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar20;
  ulong uVar18;
  float extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar19 [16];
  float fVar23;
  float fVar24;
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  float fVar25;
  Vec4 color;
  Vector<float,_4> local_a8;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  undefined1 auVar22 [16];
  
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.7;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 0.8;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (vertexData,(long)(scene->gridWidth * scene->gridHeight * scene->gridLayers * 0xc));
  iVar16 = 0;
  fVar17 = extraout_XMM0_Db;
  fVar20 = extraout_XMM0_Dd;
  while (iVar13 = iVar16, iVar13 < scene->gridHeight) {
    local_88 = (float)(iVar13 + 1);
    uStack_80 = 0;
    local_98 = (float)iVar13;
    uStack_90 = 0;
    iVar15 = 0;
    iVar14 = iVar13;
    fStack_94 = fVar17;
    fStack_8c = fVar20;
    fStack_84 = fVar17;
    fStack_7c = fVar20;
    while (iVar16 = iVar13 + 1, iVar15 < scene->gridWidth) {
      local_68 = (float)iVar15;
      auVar19._4_12_ = in_XMM1._4_12_;
      auVar19._0_4_ = (float)(iVar15 + 1);
      fStack_64 = local_88;
      fStack_5c = fStack_84;
      auVar22._12_4_ = in_XMM1._12_4_;
      auVar22._0_8_ = auVar19._0_8_;
      auVar22._8_4_ = in_XMM1._4_4_;
      auVar21._8_8_ = auVar22._8_8_;
      auVar21._4_4_ = local_98;
      auVar21._0_4_ = auVar19._0_4_;
      in_XMM1._0_12_ = auVar21._0_12_;
      in_XMM1._12_4_ = fStack_94;
      fVar23 = local_88;
      fVar20 = fStack_84;
      local_78 = in_XMM1;
      fStack_60 = fVar17;
      for (iVar16 = 0; fVar17 = fVar23, iVar16 < scene->gridLayers; iVar16 = iVar16 + 1) {
        v = &local_58;
        if ((iVar14 + iVar16 & 1U) == 0) {
          v = &local_48;
        }
        tcu::Vector<float,_4>::Vector(&local_a8,v);
        uVar1 = scene->gridWidth;
        uVar3 = scene->gridHeight;
        auVar10._4_4_ = fStack_64;
        auVar10._0_4_ = local_68;
        auVar10._8_4_ = fStack_60;
        auVar10._12_4_ = fStack_5c;
        auVar6._4_4_ = (float)(int)uVar3;
        auVar6._0_4_ = (float)(int)uVar1;
        auVar6._8_8_ = 0;
        auVar19 = divps(auVar10,auVar6);
        fVar17 = auVar19._0_4_ + -0.5;
        fVar20 = auVar19._4_4_ + -0.5;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 ((uVar1 * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc;
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        fVar17 = fVar17 + fVar17;
        fVar20 = fVar20 + fVar20;
        uVar18 = CONCAT44(fVar20,fVar17);
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar18;
        auVar4._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         (vertexData->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start
         [((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 1].m_data =
             auVar4;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 (int)(((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc | 2
                      );
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        uVar11 = ((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc | 3;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar2[(int)uVar11].m_data[0] = fVar17;
        pVVar2[(int)uVar11].m_data[2] = 0.0;
        pVVar2[(int)uVar11].m_data[3] = 1.0;
        auVar7._4_4_ = (float)(int)uVar3;
        auVar7._0_4_ = (float)(int)uVar1;
        auVar7._8_8_ = 0;
        auVar19 = divps(local_78,auVar7);
        fVar17 = auVar19._0_4_ + -0.5;
        fVar23 = auVar19._4_4_ + -0.5;
        fVar24 = auVar19._8_4_ + 0.0;
        fVar25 = auVar19._12_4_ + 0.0;
        fVar17 = fVar17 + fVar17;
        fVar23 = fVar23 + fVar23;
        in_XMM1._0_8_ = CONCAT44(fVar23,fVar17);
        in_XMM1._8_4_ = fVar24 + fVar24;
        in_XMM1._12_4_ = fVar25 + fVar25;
        pVVar2[(int)uVar11].m_data[1] = fVar23;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 (((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 4);
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        auVar8._8_4_ = 0;
        auVar8._0_8_ = in_XMM1._0_8_;
        auVar8._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         (vertexData->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start
         [((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 5].m_data =
             auVar8;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 (((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 6);
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        auVar5._8_4_ = 0;
        auVar5._0_8_ = uVar18;
        auVar5._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         (vertexData->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start
         [((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 7].m_data =
             auVar5;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 (((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 8);
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        auVar9._8_4_ = 0;
        auVar9._0_8_ = in_XMM1._0_8_;
        auVar9._12_4_ = 0x3f800000;
        *(undefined1 (*) [16])
         (vertexData->
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)._M_impl
         .super__Vector_impl_data._M_start
         [((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 9].m_data =
             auVar9;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start +
                 (((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 10);
        *(undefined8 *)pVVar2->m_data = local_a8.m_data._0_8_;
        *(undefined8 *)(pVVar2->m_data + 2) = local_a8.m_data._8_8_;
        iVar12 = ((scene->gridWidth * iVar13 + iVar15) * scene->gridLayers + iVar16) * 0xc + 0xb;
        pVVar2 = (vertexData->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar2[iVar12].m_data[0] = fVar17;
        pVVar2[iVar12].m_data[1] = fVar20;
        pVVar2[iVar12].m_data[2] = 0.0;
        pVVar2[iVar12].m_data[3] = 1.0;
        fVar23 = fVar20;
      }
      iVar14 = iVar14 + 1;
      iVar15 = iVar15 + 1;
    }
  }
  return;
}

Assistant:

static void generateLayeredGridVertexAttribData4C4V (std::vector<tcu::Vec4>& vertexData, const LayeredGridSpec& scene)
{
	// interleave color & vertex data
	const tcu::Vec4 green	(0.0f, 1.0f, 0.0f, 0.7f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 0.8f);

	vertexData.resize(getLayeredGridNumVertices(scene) * 2);

	for (int cellY = 0; cellY < scene.gridHeight; ++cellY)
	for (int cellX = 0; cellX < scene.gridWidth; ++cellX)
	for (int cellZ = 0; cellZ < scene.gridLayers; ++cellZ)
	{
		const tcu::Vec4	color		= (((cellX + cellY + cellZ) % 2) == 0) ? (green) : (yellow);
		const float		cellLeft	= (float(cellX  ) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellRight	= (float(cellX+1) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellTop		= (float(cellY+1) / (float)scene.gridHeight - 0.5f) * 2.0f;
		const float		cellBottom	= (float(cellY  ) / (float)scene.gridHeight - 0.5f) * 2.0f;

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  0] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  1] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  2] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  3] = tcu::Vec4(cellLeft, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  4] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  5] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  6] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  7] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  8] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  9] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 10] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 11] = tcu::Vec4(cellRight, cellTop, 0.0f, 1.0f);
	}
}